

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen12Platform.cpp
# Opt level: O3

uint8_t __thiscall
GmmLib::PlatformInfoGen12::ValidateCCS(PlatformInfoGen12 *this,GMM_TEXTURE_INFO *Surf)

{
  undefined1 *puVar1;
  GMM_RESOURCE_TYPE GVar2;
  anon_struct_8_45_9b07292e_for_Gpu aVar3;
  anon_struct_8_44_94931171_for_Info aVar4;
  uint uVar5;
  
  aVar3 = (Surf->Flags).Gpu;
  if (((aVar3._0_4_ >> 0x15 & 1) == 0) &&
     (aVar4 = (Surf->Flags).Info, ((ulong)aVar4 & 0x20100000) == 0)) {
    if (((ulong)aVar4 >> 0x2d & 1) != 0) {
      return '\0';
    }
    if (((ulong)(((this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.
                 pGmmLibContext)->SkuTable).field_1 & 0x400000000) == 0) {
      return '\0';
    }
  }
  GVar2 = Surf->Type;
  aVar4 = (Surf->Flags).Info;
  if (GVar2 - RESOURCE_2D < 3) {
    if (((ulong)aVar4 & 0x185000000000) != 0) goto LAB_0018fcbe;
  }
  else if ((GVar2 == RESOURCE_BUFFER & (byte)((ulong)aVar4 >> 0x13) & 1) != 0) goto LAB_0018fcbe;
  if ((aVar4._4_4_ >> 3 & 1) != 0 ||
      ((((this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.pGmmLibContext)
       ->SkuTable).field_1.field_0x3 & 2) == 0) {
    return '\0';
  }
LAB_0018fcbe:
  uVar5 = SUB84((((this->super_PlatformInfoGen11).super_PlatformInfoGen10.super_PlatformInfo.
                 pGmmLibContext)->SkuTable).field_1,0);
  if ((((uVar5 >> 0x19 & 1) == 0) &&
      (GVar2 == RESOURCE_BUFFER && (aVar4._0_4_ & 0x20080000) == 0x80000)) ||
     ((~aVar4._0_4_ & 0x20100000) == 0 ||
      ((ulong)aVar4 & 0x200020100000) == 0x200000000000 && ((ulong)aVar3 & 0xa0000200000) == 0)) {
    return '\0';
  }
  if ((uVar5 >> 0x12 & 1) == 0) {
    if (((ulong)aVar4 & 0x106000000000) == 0) {
      return '\0';
    }
    if (GVar2 == RESOURCE_3D) {
      return '\0';
    }
    if (Surf->MaxLod != 0) {
      return '\0';
    }
    if (1 < (Surf->MSAA).NumSamples) {
      return '\0';
    }
  }
  puVar1 = &(Surf->Flags).Wa.field_0x1;
  *puVar1 = *puVar1 & 0xfb;
  return '\x01';
}

Assistant:

uint8_t GmmLib::PlatformInfoGen12::ValidateCCS(GMM_TEXTURE_INFO &Surf)
{

    if (!(                                    //--- Legitimate CCS Case ----------------------------------------
        ((Surf.Flags.Gpu.ProceduralTexture || //procedural texture, or compressed surface (no more separate Aux-CCS)
          Surf.Flags.Info.RenderCompressed || Surf.Flags.Info.MediaCompressed) ||
         pGmmLibContext->GetSkuTable().FtrXe2Compression && !Surf.Flags.Info.NotCompressed) &&
        (((Surf.Type >= RESOURCE_2D && Surf.Type <= RESOURCE_CUBE) &&       //Not supported: 1D (until Flat CCS); Others Supported: Buffer, 2D, 3D, cube, Arrays, mip-maps, MSAA, Depth/Stencil
          (GMM_IS_4KB_TILE(Surf.Flags) || GMM_IS_64KB_TILE(Surf.Flags))) || //Only on 2D + Y/Ys or Lienar buffer (until Flat CCS)
         (Surf.Flags.Info.Linear && Surf.Type == RESOURCE_BUFFER) ||
         ((pGmmLibContext->GetSkuTable().FtrFlatPhysCCS) && !Surf.Flags.Info.TiledX))))
    {
        GMM_ASSERTDPF(0, "Invalid CCS usage!");
        return 0;
    }

    if (!pGmmLibContext->GetSkuTable().FtrFlatPhysCCS &&
        Surf.Flags.Info.Linear && Surf.Type == RESOURCE_BUFFER && !Surf.Flags.Info.RenderCompressed)
    {
        GMM_ASSERTDPF(0, "Invalid CCS usage - MLC only supported as RC!");
        return 0;
    }

    //Compressed resource (main surf) must pre-define MC/RC type
    if(!(Surf.Flags.Gpu.__NonMsaaTileYCcs || Surf.Flags.Gpu.__NonMsaaLinearCCS) &&
       !Surf.Flags.Gpu.ProceduralTexture &&
        !(Surf.Flags.Info.RenderCompressed || Surf.Flags.Info.MediaCompressed || !Surf.Flags.Info.NotCompressed))
    {
        GMM_ASSERTDPF(0, "Invalid CCS usage - RC/MC type unspecified!");
        return 0;
    }

    if(Surf.Flags.Info.RenderCompressed && Surf.Flags.Info.MediaCompressed)
    {
        GMM_ASSERTDPF(0, "Invalid CCS usage - can't be both RC and MC!");
        return 0;
    }

    if(!pGmmLibContext->GetSkuTable().FtrLinearCCS &&
       (Surf.Type == RESOURCE_3D || Surf.MaxLod > 0 || Surf.MSAA.NumSamples > 1 ||
        !(Surf.Flags.Info.TiledYf || GMM_IS_64KB_TILE(Surf.Flags))))
    {
        GMM_ASSERTDPF(0, "CCS support for (volumetric, mip'd, MSAA'd, TileY) resources only enabled with Linear CCS!");
        return 0;
    }

    GMM_ASSERTDPF((Surf.Flags.Wa.PreGen12FastClearOnly == 0), "FastClear Only unsupported on Gen12+!");
    Surf.Flags.Wa.PreGen12FastClearOnly = 0;

    return 1;
}